

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhStoreCell(lhpage *pPage,void *pKey,sxu32 nKeyLen,void *pData,unqlite_int64 nDataLen,
               sxu32 nHash,int auto_append)

{
  int iVar1;
  sxu16 local_5a;
  int rc;
  sxu16 nOfft;
  lhcell *pCell;
  lhash_kv_engine *plStack_48;
  int iNeedOvfl;
  lhash_kv_engine *pEngine;
  sxu64 sStack_38;
  sxu32 nHash_local;
  unqlite_int64 nDataLen_local;
  void *pData_local;
  void *pvStack_20;
  sxu32 nKeyLen_local;
  void *pKey_local;
  lhpage *pPage_local;
  
  plStack_48 = pPage->pHash;
  pCell._4_4_ = 0;
  pEngine._4_4_ = nHash;
  sStack_38 = nDataLen;
  nDataLen_local = (unqlite_int64)pData;
  pData_local._4_4_ = nKeyLen;
  pvStack_20 = pKey;
  pKey_local = pPage;
  pPage_local._4_4_ = (*plStack_48->pIo->xWrite)(pPage->pRaw);
  if (pPage_local._4_4_ == 0) {
    iVar1 = lhAllocateSpace((lhpage *)pKey_local,(pData_local._4_4_ + 0x1a) + sStack_38,&local_5a);
    if (iVar1 != 0) {
      iVar1 = lhAllocateSpace((lhpage *)pKey_local,0x1a,&local_5a);
      if (iVar1 != 0) {
        if (auto_append == 0) {
          return -0x49;
        }
        iVar1 = lhSlaveStore((lhpage *)pKey_local,pvStack_20,pData_local._4_4_,
                             (void *)nDataLen_local,sStack_38,pEngine._4_4_);
        return iVar1;
      }
      pCell._4_4_ = 1;
    }
    _rc = lhNewCell(plStack_48,(lhpage *)pKey_local);
    if (_rc == (lhcell *)0x0) {
      (*plStack_48->pIo->xErr)(plStack_48->pIo->pHandle,"KV store is running out of memory");
      pPage_local._4_4_ = -1;
    }
    else {
      _rc->iStart = local_5a;
      _rc->nKey = pData_local._4_4_;
      _rc->nData = sStack_38;
      _rc->nHash = pEngine._4_4_;
      if (pData_local._4_4_ < 0x40000) {
        SyBlobAppend(&_rc->sKey,pvStack_20,pData_local._4_4_);
      }
      pPage_local._4_4_ = lhInstallCell(_rc);
      if (pPage_local._4_4_ == 0) {
        if (pCell._4_4_ == 0) {
          lhCellWriteLocalPayload(_rc,pvStack_20,pData_local._4_4_,(void *)nDataLen_local,sStack_38)
          ;
        }
        else {
          iVar1 = lhCellWriteOvflPayload
                            (_rc,pvStack_20,pData_local._4_4_,nDataLen_local,sStack_38,0);
          if (iVar1 != 0) {
            lhCellDiscard(_rc);
            return iVar1;
          }
        }
        lhCellWriteHeader(_rc);
        pPage_local._4_4_ = 0;
      }
    }
  }
  return pPage_local._4_4_;
}

Assistant:

static int lhStoreCell(
	lhpage *pPage, /* Target page */
	const void *pKey,sxu32 nKeyLen, /* Payload: Key */
	const void *pData,unqlite_int64 nDataLen, /* Payload: Data */
	sxu32 nHash, /* Hash of the key */
	int auto_append /* Auto append a slave page if full */
	)
{
	lhash_kv_engine *pEngine = pPage->pHash;
	int iNeedOvfl = 0; /* Need overflow page for this cell and its payload*/
	lhcell *pCell;
	sxu16 nOfft;
	int rc;
	/* Acquire a writer lock on this page first */
	rc = pEngine->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Check for a free block  */
	rc = lhAllocateSpace(pPage,L_HASH_CELL_SZ+nKeyLen+nDataLen,&nOfft);
	if( rc != UNQLITE_OK ){
		/* Check for a free block to hold a single cell only (without payload) */
		rc = lhAllocateSpace(pPage,L_HASH_CELL_SZ,&nOfft);
		if( rc != UNQLITE_OK ){
			if( !auto_append ){
				/* A split must be done */
				return UNQLITE_FULL;
			}else{
				/* Store this record in a slave page */
				rc = lhSlaveStore(pPage,pKey,nKeyLen,pData,nDataLen,nHash);
				return rc;
			}
		}
		iNeedOvfl = 1;
	}
	/* Allocate a new cell instance */
	pCell = lhNewCell(pEngine,pPage);
	if( pCell == 0 ){
		pEngine->pIo->xErr(pEngine->pIo->pHandle,"KV store is running out of memory");
		return UNQLITE_NOMEM;
	}
	/* Fill-in the structure */
	pCell->iStart = nOfft;
	pCell->nKey = nKeyLen;
	pCell->nData = (sxu64)nDataLen;
	pCell->nHash = nHash;
	if( nKeyLen < 262144 /* 256 KB */ ){
		/* Keep the key in-memory for fast lookup */
		SyBlobAppend(&pCell->sKey,pKey,nKeyLen);
	}
	/* Link the cell */
	rc = lhInstallCell(pCell);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Write the payload */
	if( iNeedOvfl ){
		rc = lhCellWriteOvflPayload(pCell,pKey,nKeyLen,pData,nDataLen,(const void *)0);
		if( rc != UNQLITE_OK ){
			lhCellDiscard(pCell);
			return rc;
		}
	}else{
		lhCellWriteLocalPayload(pCell,pKey,nKeyLen,pData,nDataLen);
	}
	/* Finally, Write the cell header */
	lhCellWriteHeader(pCell);
	/* All done */
	return UNQLITE_OK;
}